

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseData<std::__cxx11::list<int,_std::allocator<int>_>_>::notify
          (PromiseData<std::__cxx11::list<int,_std::allocator<int>_>_> *this,
          QVector<Handler> *handlers)

{
  pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *ppVar1;
  char cVar2;
  QObject *pQVar3;
  QEvent *this_00;
  long lVar4;
  QThread *pQVar5;
  function<void_(const_bool_&)> *__x;
  PromiseValue<std::__cxx11::list<int,_std::allocator<int>_>_> value;
  type_conflict2 local_60;
  
  std::__shared_ptr<std::__cxx11::list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<std::__cxx11::list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                *)&value,
               (__shared_ptr<std::__cxx11::list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                *)&this->m_value);
  ppVar1 = (handlers->d).ptr;
  lVar4 = (handlers->d).size * 0x30;
  do {
    __x = &ppVar1->second;
    if (lVar4 == 0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&value.m_data.
                  super___shared_ptr<std::__cxx11::list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      return;
    }
    std::function<void_(const_std::__cxx11::list<int,_std::allocator<int>_>_&)>::function
              (&local_60.fn,
               (function<void_(const_std::__cxx11::list<int,_std::allocator<int>_>_&)> *)__x);
    std::__shared_ptr<std::__cxx11::list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<std::__cxx11::list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)&local_60.value,
                 (__shared_ptr<std::__cxx11::list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)&value);
    if ((*(long *)((long)(__x + -1) + 0x10) != 0) &&
       (*(long *)((long)(__x + -1) + 0x18) != 0 &&
        *(int *)(*(long *)((long)(__x + -1) + 0x10) + 4) != 0)) {
      cVar2 = QThread::isFinished();
      if (cVar2 == '\0') {
        if ((*(long *)((long)(__x + -1) + 0x10) == 0) ||
           (*(int *)(*(long *)((long)(__x + -1) + 0x10) + 4) == 0)) {
          pQVar5 = (QThread *)0x0;
        }
        else {
          pQVar5 = *(QThread **)((long)(__x + -1) + 0x18);
        }
        pQVar3 = (QObject *)QAbstractEventDispatcher::instance(pQVar5);
        if (pQVar3 == (QObject *)0x0) {
          cVar2 = QCoreApplication::closingDown();
          if (cVar2 != '\0') goto LAB_0011a018;
        }
        this_00 = (QEvent *)operator_new(0x40);
        QEvent::QEvent(this_00,None);
        *(undefined ***)this_00 = &PTR__Event_00130340;
        PromiseData<std::__cxx11::list<int,std::allocator<int>>>::
        notify(QList<std::pair<QPointer<QThread>,std::function<void(std::__cxx11::list<int,std::allocator<int>>const&)>>>const&)
        ::{lambda()#1}::QList((_lambda___1_ *)(this_00 + 0x10),&local_60);
        QCoreApplication::postEvent(pQVar3,this_00,0);
      }
    }
LAB_0011a018:
    PromiseData<std::__cxx11::list<int,std::allocator<int>>>::
    notify(QList<std::pair<QPointer<QThread>,std::function<void(std::__cxx11::list<int,std::allocator<int>>const&)>>>const&)
    ::{lambda()#1}::~QList((_lambda___1_ *)&local_60);
    ppVar1 = (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)(__x + 1);
    lVar4 = lVar4 + -0x30;
  } while( true );
}

Assistant:

void notify(const QVector<Handler>& handlers) Q_DECL_OVERRIDE
    {
        PromiseValue<T> value = m_value;
        Q_ASSERT(!value.isNull());

        for (const auto& handler : handlers) {
            const auto& fn = handler.second;
            qtpromise_defer(
                [=]() {
                    fn(value.data());
                },
                handler.first);
        }
    }